

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O1

void __thiscall Dialog::configure_all(Dialog *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  _List_node_base *p_Var5;
  int iVar6;
  int iVar7;
  _List_node_base *p_Var8;
  
  iVar6 = al_get_display_width(this->display);
  iVar6 = iVar6 / this->grid_m;
  iVar7 = al_get_display_height(this->display);
  iVar7 = iVar7 / this->grid_n;
  p_Var8 = (this->all_widgets).super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl._M_node
           .super__List_node_base._M_next;
  if (p_Var8 != (_List_node_base *)&this->all_widgets) {
    uVar1 = this->x_padding;
    uVar2 = this->y_padding;
    do {
      p_Var5 = p_Var8[1]._M_next;
      iVar3 = *(int *)&p_Var5->_M_prev;
      iVar4 = *(int *)((long)&p_Var5->_M_prev + 4);
      *(uint *)&p_Var5[2]._M_next = iVar3 * iVar6 + uVar1;
      *(uint *)((long)(p_Var5 + 2) + 4) = iVar4 * iVar7 + uVar2;
      *(uint *)((long)(p_Var5 + 2) + 8) = (iVar3 + *(int *)&p_Var5[1]._M_next) * iVar6 + ~uVar1;
      *(uint *)((long)(p_Var5 + 2) + 0xc) =
           (iVar4 + *(int *)((long)(p_Var5 + 1) + 4)) * iVar7 + ~uVar2;
      p_Var8 = p_Var8->_M_next;
    } while (p_Var8 != (_List_node_base *)&this->all_widgets);
  }
  return;
}

Assistant:

void Dialog::configure_all()
{
   const int xsize = al_get_display_width(display) / this->grid_m;
   const int ysize = al_get_display_height(display) / this->grid_n;

   for (std::list<Widget*>::iterator it = this->all_widgets.begin();
         it != this->all_widgets.end();
         ++it)
   {
      (*it)->configure(xsize, ysize, this->x_padding, this->y_padding);
   }
}